

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::find<unsigned_long>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *this,key_arg<unsigned_long> *key)

{
  size_t sVar1;
  ulong uVar2;
  iterator iVar3;
  
  AssertNotDebugCapacity(this);
  sVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar1 == 1) {
    iVar3 = find_soo<unsigned_long>(this,key);
    return iVar3;
  }
  if (sVar1 != 0) {
    prefetch_heap_block(this);
    uVar2 = (*key ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
    iVar3 = find_non_soo<unsigned_long>
                      (this,key,uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                                (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
    return iVar3;
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, absl::hash_internal::Hash<unsigned long>, std::equal_to<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = absl::hash_internal::Hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
               );
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }